

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcBinaryStream.h
# Opt level: O2

unsigned_long __thiscall
o3dgc::BinaryStream::ReadUInt32
          (BinaryStream *this,unsigned_long *position,O3DGCStreamType streamType)

{
  byte bVar1;
  uchar uVar2;
  byte bVar3;
  O3DGCEndianness OVar4;
  unsigned_long uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (streamType == O3DGC_STREAM_TYPE_ASCII) {
    uVar5 = ReadUInt32ASCII(this,position);
    return uVar5;
  }
  uVar6 = *position;
  if (uVar6 < (this->m_stream).m_size - 4) {
    OVar4 = this->m_endianness;
    *position = uVar6 + 1;
    bVar1 = (this->m_stream).m_buffer[uVar6];
    if (OVar4 == O3DGC_BIG_ENDIAN) {
      *position = uVar6 + 2;
      bVar3 = (this->m_stream).m_buffer[uVar6 + 1];
      *position = uVar6 + 3;
      uVar7 = (ulong)(this->m_stream).m_buffer[uVar6 + 2] << 8 |
              (ulong)bVar3 << 0x10 | (long)(int)((uint)bVar1 << 0x18);
      *position = uVar6 + 4;
      uVar6 = (ulong)(this->m_stream).m_buffer[uVar6 + 3];
    }
    else {
      *position = uVar6 + 2;
      uVar2 = (this->m_stream).m_buffer[uVar6 + 1];
      *position = uVar6 + 3;
      uVar7 = (ulong)CONCAT12((this->m_stream).m_buffer[uVar6 + 2],CONCAT11(uVar2,bVar1));
      *position = uVar6 + 4;
      uVar6 = (ulong)(int)((uint)(this->m_stream).m_buffer[uVar6 + 3] << 0x18);
    }
    return uVar6 | uVar7;
  }
  __assert_fail("position < m_stream.GetSize() - 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcBinaryStream.h"
                ,0xf0,"unsigned long o3dgc::BinaryStream::ReadUInt32Bin(unsigned long &) const");
}

Assistant:

unsigned long           ReadUInt32(unsigned long & position, O3DGCStreamType streamType) const
                                {
                                    unsigned long value;
                                    if (streamType == O3DGC_STREAM_TYPE_ASCII)
                                    {
                                        value = ReadUInt32ASCII(position);
                                    }
                                    else
                                    {
                                        value = ReadUInt32Bin(position);
                                    }
                                    return value;
                                }